

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencc.c
# Opt level: O2

char * opencc_convert_utf8(opencc_t t_opencc,char *inbuf,size_t length)

{
  size_t sVar1;
  ucs4_t *str;
  char *__s;
  ucs4_t *puVar2;
  size_t sVar3;
  char *__s_00;
  size_t __n;
  char *pcVar4;
  long lVar5;
  char *__dest;
  ucs4_t *poutbuf;
  size_t outbuf_left;
  size_t inbuf_left;
  size_t local_50;
  ucs4_t *local_48;
  opencc_t local_40;
  ucs4_t *pinbuf;
  
  if (lib_initialized == '\0') {
    lib_initialized = '\x01';
  }
  local_40 = t_opencc;
  if ((length == 0xffffffffffffffff) || (sVar1 = strlen(inbuf), sVar1 < length)) {
    length = strlen(inbuf);
  }
  str = utf8_to_ucs4(inbuf,length);
  if (str == (ucs4_t *)0xffffffffffffffff) {
LAB_001049f4:
    errnum = OPENCC_ERROR_ENCODIND;
    pcVar4 = (char *)0xffffffffffffffff;
  }
  else {
    __s = (char *)malloc(length + 1);
    *__s = '\0';
    puVar2 = (ucs4_t *)malloc(length * 4 + 0x104);
    poutbuf = puVar2;
    pinbuf = str;
    inbuf_left = ucs4len(str);
    sVar1 = length;
    pcVar4 = __s;
    local_50 = length + 0x40;
    local_48 = puVar2;
    while (puVar2 = local_48, outbuf_left = local_50, inbuf_left != 0) {
      sVar3 = opencc_convert(local_40,&pinbuf,&inbuf_left,&poutbuf,&outbuf_left);
      if (sVar3 == 0xffffffffffffffff) {
        free(pcVar4);
        free(str);
        free(puVar2);
        return (char *)0xffffffffffffffff;
      }
      *poutbuf = 0;
      __s_00 = ucs4_to_utf8(puVar2,0xffffffffffffffff);
      if (__s_00 == (char *)0xffffffffffffffff) {
        free(pcVar4);
        free(str);
        free(puVar2);
        goto LAB_001049f4;
      }
      __n = strlen(__s_00);
      __dest = pcVar4;
      while (length < __n) {
        lVar5 = (long)__dest - (long)__s;
        __s = (char *)realloc(__s,sVar1 * 2);
        __dest = __s + lVar5;
        length = length + sVar1;
        sVar1 = sVar1 * 2;
      }
      strncpy(__dest,__s_00,__n);
      free(__s_00);
      pcVar4 = __dest + __n;
      __dest[__n] = '\0';
      poutbuf = local_48;
    }
    free(str);
    free(puVar2);
    sVar1 = strlen(__s);
    pcVar4 = (char *)realloc(__s,sVar1 + 1);
  }
  return pcVar4;
}

Assistant:

char * opencc_convert_utf8(opencc_t t_opencc, const char * inbuf, size_t length)
{
	if (!lib_initialized)
		lib_initialize();

	if (length == (size_t) -1 || length > strlen(inbuf))
		length = strlen(inbuf);

	/* 將輸入數據轉換爲ucs4_t字符串 */
	ucs4_t * winbuf = utf8_to_ucs4(inbuf, length);
	if (winbuf == (ucs4_t *) -1)
	{
		/* 輸入數據轉換失敗 */
		errnum = OPENCC_ERROR_ENCODIND;
		return (char *) -1;
	}

	/* 設置輸出UTF8文本緩衝區空間 */
	size_t outbuf_len = length;
	size_t outsize = outbuf_len;
	char * original_outbuf = (char *) malloc(sizeof(char) * (outbuf_len + 1));
	char * outbuf = original_outbuf;
	original_outbuf[0] = '\0';

	/* 設置轉換緩衝區空間 */
	size_t wbufsize = length + 64;
	ucs4_t * woutbuf = (ucs4_t *) malloc(sizeof(ucs4_t) * (wbufsize + 1));

	ucs4_t * pinbuf = winbuf;
	ucs4_t * poutbuf = woutbuf;
	size_t inbuf_left, outbuf_left;

	inbuf_left = ucs4len(winbuf);
	outbuf_left = wbufsize;

	while (inbuf_left > 0)
	{
		size_t retval = opencc_convert(t_opencc, &pinbuf, &inbuf_left, &poutbuf, &outbuf_left);
		if (retval == (size_t) -1)
		{
			free(outbuf);
			free(winbuf);
			free(woutbuf);
			return (char *) -1;
		}

		*poutbuf = L'\0';

		char * ubuff = ucs4_to_utf8(woutbuf, (size_t) -1);

		if (ubuff == (char *) -1)
		{
			free(outbuf);
			free(winbuf);
			free(woutbuf);
			errnum = OPENCC_ERROR_ENCODIND;
			return (char *) -1;
		}

		size_t ubuff_len = strlen(ubuff);

		while (ubuff_len > outsize)
		{
			size_t outbuf_offset = outbuf - original_outbuf;
			outsize += outbuf_len;
			outbuf_len += outbuf_len;
			original_outbuf = (char *) realloc(original_outbuf, sizeof(char) * outbuf_len);
			outbuf = original_outbuf + outbuf_offset;
		}

		strncpy(outbuf, ubuff, ubuff_len);
		free(ubuff);

		outbuf += ubuff_len;
		*outbuf = '\0';

		outbuf_left = wbufsize;
		poutbuf = woutbuf;
	}

	free(winbuf);
	free(woutbuf);

	original_outbuf = (char *) realloc(original_outbuf,
			sizeof(char) * (strlen(original_outbuf) + 1));

	return original_outbuf;
}